

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

void __thiscall BigInteger::multiply(BigInteger *this,uint a)

{
  undefined1 auVar1 [16];
  ulong in_RAX;
  ulong uVar2;
  ulong uVar3;
  pointer puVar4;
  ulong uVar5;
  undefined8 uStack_38;
  
  puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = 0;
  uStack_38 = in_RAX;
  for (uVar5 = 0;
      (uVar2 = (long)(this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2, uVar3 != 0 ||
      (uVar5 < uVar2)); uVar5 = uVar5 + 1) {
    if (uVar2 <= uVar5) {
      uStack_38 = uStack_38 & 0xffffffff;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&this->digits,(uint *)((long)&uStack_38 + 4));
      puVar4 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    uVar3 = (ulong)puVar4[uVar5] * (ulong)a + uVar3;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar3 = uVar3 / 1000000000;
    puVar4[uVar5] = SUB164(auVar1 % ZEXT816(1000000000),0);
  }
  return;
}

Assistant:

void BigInteger::multiply(unsigned a) noexcept
{
    long long carry = 0;
    for(size_t i = 0; carry || i < digits.size(); i++)
    {
        if(i >= digits.size())
            digits.push_back(0);
        long long new_carry = (digits[i] * 1ll * a + carry) / BLOCK_MOD;
        digits[i] = (digits[i] * 1ll * a + carry) % BLOCK_MOD;
        carry = new_carry;
    }
}